

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *__s1;
  ostream *poVar2;
  long in_RSI;
  int in_EDI;
  exception *e;
  char *libraryVersion;
  int i;
  bool verbose;
  char *outFile;
  char *inFile;
  bool in_stack_00000137;
  char *in_stack_00000138;
  char *in_stack_00000140;
  char *in_stack_ffffffffffffff98;
  ostream *in_stack_ffffffffffffffa0;
  int local_28;
  long local_20;
  long local_18;
  int local_4;
  
  local_18 = 0;
  local_20 = 0;
  if (in_EDI < 2) {
    anon_unknown.dwarf_3c12::usageMessage(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,false)
    ;
    local_4 = -1;
  }
  else {
    for (local_28 = 1; local_28 < in_EDI; local_28 = local_28 + 1) {
      iVar1 = strcmp(*(char **)(in_RSI + (long)local_28 * 8),"-v");
      if (iVar1 != 0) {
        iVar1 = strcmp(*(char **)(in_RSI + (long)local_28 * 8),"-h");
        if ((iVar1 == 0) ||
           (iVar1 = strcmp(*(char **)(in_RSI + (long)local_28 * 8),"--help"), iVar1 == 0)) {
          anon_unknown.dwarf_3c12::usageMessage
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,false);
          return 0;
        }
        iVar1 = strcmp(*(char **)(in_RSI + (long)local_28 * 8),"--version");
        if (iVar1 == 0) {
          __s1 = (char *)Imf_3_4::getLibraryVersion();
          poVar2 = std::operator<<((ostream *)&std::cout,"exr2aces (OpenEXR) ");
          std::operator<<(poVar2,"3.4.0");
          iVar1 = strcmp(__s1,"3.4.0");
          if (iVar1 != 0) {
            poVar2 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
            poVar2 = std::operator<<(poVar2,__s1);
            std::operator<<(poVar2,")");
          }
          poVar2 = std::operator<<((ostream *)&std::cout," https://openexr.com");
          std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "Copyright (c) Contributors to the OpenEXR Project");
          std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
          poVar2 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
          std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
          return 0;
        }
        if (local_18 == 0) {
          local_18 = *(long *)(in_RSI + (long)local_28 * 8);
        }
        else {
          local_20 = *(long *)(in_RSI + (long)local_28 * 8);
        }
      }
    }
    if ((local_18 == 0) || (local_20 == 0)) {
      anon_unknown.dwarf_3c12::usageMessage
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,false);
      local_4 = -1;
    }
    else {
      anon_unknown.dwarf_3c12::exr2aces(in_stack_00000140,in_stack_00000138,in_stack_00000137);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
main (int argc, char** argv)
{
    const char* inFile  = 0;
    const char* outFile = 0;
    bool        verbose = false;

    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    int i = 1;

    while (i < argc)
    {
        if (!strcmp (argv[i], "-v"))
        {
            //
            // Verbose mode
            //

            verbose = true;
            i += 1;
        }
        else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
        {
            //
            // Print help message
            //

            usageMessage (cout, "exr2aces", true);
            return 0;
        }
        else if (!strcmp (argv[i], "--version"))
        {
            const char* libraryVersion = getLibraryVersion ();

            cout << "exr2aces (OpenEXR) " << OPENEXR_VERSION_STRING;
            if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                cout << "(OpenEXR version " << libraryVersion << ")";
            cout << " https://openexr.com" << endl;
            cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
            cout << "License BSD-3-Clause" << endl;

            return 0;
        }
        else
        {
            //
            // Image file name
            //

            if (inFile == 0)
                inFile = argv[i];
            else
                outFile = argv[i];

            i += 1;
        }
    }

    if (inFile == 0 || outFile == 0)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    //
    // Load inFile, and save a tiled version in outFile.
    //

    try
    {
        exr2aces (inFile, outFile, verbose);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ":  " << e.what () << endl;
        return 1;
    }

    return 0;
}